

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_RDVL(DisasContext_conflict1 *s,arg_RDVL *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  uintptr_t o;
  TCGv_i64 pTVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    pTVar2 = cpu_reg_aarch64(s,a->rd);
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(pTVar2 + (long)tcg_ctx),
                        (long)s->sve_len * (long)a->imm);
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_RDVL(DisasContext *s, arg_RDVL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 reg = cpu_reg(s, a->rd);
        tcg_gen_movi_i64(tcg_ctx, reg, a->imm * vec_full_reg_size(s));
    }
    return true;
}